

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

bool compress_file(ilzham *lzham_dll,char *pSrc_filename,char *pDst_filename,comp_options *options,
                  char *pSeed_filename,float *pTotal_comp_time)

{
  unkuint9 Var1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  lzham_compress_status_t lVar6;
  lzham_uint32 lVar7;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar8;
  void *__ptr;
  lzham_uint8 *__ptr_00;
  timer_ticks tVar9;
  lzham_compress_state_ptr pvVar10;
  timer_ticks tVar11;
  lzham_compress_state_ptr pvVar12;
  size_t sVar13;
  __off64_t _Var14;
  ulong uVar15;
  int iVar16;
  char *pMsg;
  ulong uVar17;
  long lVar18;
  size_t __n;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  size_t out_num_bytes;
  size_t num_in_bytes;
  float local_d8;
  size_t local_b0;
  int local_a8;
  int local_a4;
  lzham_compress_params local_a0;
  undefined1 local_68 [16];
  timer_ticks local_58;
  ulong local_50;
  ulong local_48;
  float *local_40;
  __off64_t local_38;
  
  if (pTotal_comp_time != (float *)0x0) {
    *pTotal_comp_time = 0.0;
  }
  puts("Testing: Streaming compression");
  __stream = fopen64(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    pMsg = "Unable to read file: %s\n";
    pDst_filename = pSrc_filename;
  }
  else {
    __stream_00 = fopen64(pDst_filename,"wb");
    if (__stream_00 != (FILE *)0x0) {
      lVar18 = 0;
      fseeko64(__stream,0,2);
      uVar8 = ftello64(__stream);
      fseeko64(__stream,0,0);
      fputc(0x4c,__stream_00);
      fputc(0x5a,__stream_00);
      fputc(0x48,__stream_00);
      fputc(0x30,__stream_00);
      fputc(options->m_dict_size_log2,__stream_00);
      do {
        fputc((uint)(uVar8 >> ((byte)lVar18 & 0x3f)) & 0xff,__stream_00);
        lVar18 = lVar18 + 8;
      } while (lVar18 != 0x40);
      local_38 = ftello64(__stream_00);
      __ptr = (void *)memalign(0x10,0x40000);
      __ptr_00 = (lzham_uint8 *)memalign(0x10,0x40000);
      if ((__ptr == (void *)0x0) || (__ptr_00 == (lzham_uint8 *)0x0)) {
        print_error("Out of memory!\n");
        free(__ptr);
        free(__ptr_00);
        fclose(__stream);
        fclose(__stream_00);
        return false;
      }
      local_58 = timer::get_ticks();
      local_a0.m_pSeed_bytes = (void *)0x0;
      local_a0.m_table_max_update_interval = 0;
      local_a0.m_table_update_interval_slow_rate = 0;
      local_a0.m_num_seed_bytes = 0;
      local_a0._28_4_ = 0;
      local_a0.m_struct_size = 0x38;
      local_a0.m_dict_size_log2 = options->m_dict_size_log2;
      local_a0.m_compress_flags = 0;
      local_a0.m_max_helper_threads = options->m_max_helper_threads;
      local_a0.m_level = options->m_comp_level;
      uVar4 = 0;
      if (options->m_extreme_parsing == true) {
        local_a0.m_compress_flags = 2;
        uVar4 = 2;
      }
      uVar5 = uVar4;
      if (options->m_deterministic_parsing == true) {
        uVar5 = uVar4 | 4;
        local_a0._16_8_ = CONCAT44(uVar4,local_a0.m_max_helper_threads) | 0x400000000;
      }
      uVar4 = uVar5;
      if (options->m_tradeoff_decomp_rate_for_comp_ratio == true) {
        uVar4 = uVar5 | 0x10;
        local_a0._16_8_ = CONCAT44(uVar5,local_a0.m_max_helper_threads) | 0x1000000000;
      }
      uVar5 = uVar4;
      if (options->m_force_single_threaded_parsing == true) {
        uVar5 = uVar4 | 0x40;
        local_a0._16_8_ = CONCAT44(uVar4,local_a0.m_max_helper_threads) | 0x4000000000;
      }
      if (options->m_low_memory_finder == true) {
        local_a0._16_8_ = CONCAT44(uVar5,local_a0.m_max_helper_threads) | 0x8000000000;
      }
      local_a0.m_fast_bytes = options->m_fast_bytes;
      local_a0.m_table_update_rate = options->m_table_update_rate;
      local_a0.m_extreme_parsing_max_best_arrivals = options->m_max_best_arrivals;
      if ((pSeed_filename != (char *)0x0) &&
         (bVar3 = read_seed_file(pSeed_filename,&local_a0.m_num_seed_bytes,&local_a0.m_pSeed_bytes,
                                 local_a0.m_dict_size_log2), !bVar3)) {
        free(__ptr);
        free(__ptr_00);
        fclose(__stream);
        fclose(__stream_00);
        return false;
      }
      local_40 = pTotal_comp_time;
      tVar9 = timer::get_ticks();
      pvVar10 = (*lzham_dll->lzham_compress_init)(&local_a0);
      tVar11 = timer::get_ticks();
      dVar19 = timer::ticks_to_secs(tVar11 - tVar9);
      if (pvVar10 != (lzham_compress_state_ptr)0x0) {
        if ((options->m_test_compressor_reinit != true) ||
           (pvVar12 = (*lzham_dll->lzham_compress_reinit)(pvVar10),
           pvVar12 != (lzham_compress_state_ptr)0x0)) {
          dVar20 = timer::ticks_to_secs(tVar11 - tVar9);
          printf("lzham_compress_init took %3.3fms\n",dVar20 * 1000.0);
          bVar3 = options->m_test_compressor_reinit;
          Var1 = (unkuint9)uVar8;
          local_d8 = (float)dVar19;
          local_a8 = bVar3 + 1;
          __n = 0;
          uVar4 = 0;
          uVar17 = uVar8;
          iVar16 = 0;
          local_50 = uVar8;
          while( true ) {
            local_a4 = iVar16;
            if (uVar17 != 0) {
              tVar9 = timer::get_ticks();
              dVar19 = timer::ticks_to_secs(tVar9 - local_58);
              lVar18 = uVar17 - uVar8;
              auVar22._8_4_ = (int)((ulong)lVar18 >> 0x20);
              auVar22._0_8_ = lVar18;
              auVar22._12_4_ = 0x45300000;
              dVar20 = auVar22._8_8_ - 1.9342813113834067e+25;
              local_68._8_4_ = SUB84(dVar20,0);
              local_68._0_8_ =
                   (dVar20 + ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) /
                   dVar19;
              local_68._12_4_ = (int)((ulong)dVar20 >> 0x20);
              iVar16 = 0xf;
              do {
                printf("\b\b\b\b");
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
              printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec",
                     (double)((1.0 - (float)uVar8 / (float)(unkint9)Var1) * 100.0),
                     (double)((float)uVar8 * 9.536743e-07),
                     -(uint)(0.0 < dVar19) & SUB84((double)local_68._0_8_ * 9.5367431640625e-07,0));
              printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
            }
            if (uVar4 == (uint)__n) break;
LAB_00104ceb:
            local_48 = (ulong)((int)__n - uVar4);
            local_b0 = 0x40000;
            tVar9 = timer::get_ticks();
            lVar6 = (*lzham_dll->lzham_compress)
                              (pvVar10,(lzham_uint8 *)((ulong)uVar4 + (long)__ptr),&local_48,
                               __ptr_00,&local_b0,SUB14(uVar8 == 0,0));
            tVar11 = timer::get_ticks();
            dVar19 = timer::ticks_to_secs(tVar11 - tVar9);
            uVar4 = uVar4 + (int)local_48;
            if (local_b0 != 0) {
              local_68._0_8_ = dVar19;
              sVar13 = fwrite(__ptr_00,1,local_b0 & 0xffffffff,__stream_00);
              dVar19 = (double)local_68._0_8_;
              if (sVar13 != local_b0) {
                putchar(10);
                print_error("Failure writing to destination file!\n");
                free(__ptr);
                goto LAB_00105068;
              }
            }
            local_d8 = local_d8 + (float)dVar19;
            uVar17 = local_50;
            iVar16 = local_a4;
            if (LZHAM_COMP_STATUS_HAS_MORE_OUTPUT < lVar6) {
              iVar16 = 0xf;
              do {
                printf("\b\b\b\b    \b\b\b\b");
                uVar17 = local_50;
                iVar2 = local_a4;
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
              if ((bVar3 & local_a4 == 0) != 0) {
                putchar(10);
                _Var14 = ftello64(__stream_00);
                printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",uVar17,
                       _Var14);
                tVar9 = timer::get_ticks();
                pvVar12 = (*lzham_dll->lzham_compress_reinit)(pvVar10);
                if (pvVar12 == (lzham_compress_state_ptr)0x0) {
                  print_error("Failed reinitializing compressor!\n");
                  free(__ptr);
                  free(__ptr_00);
                  fclose(__stream);
                  goto LAB_0010507c;
                }
                tVar11 = timer::get_ticks();
                dVar19 = timer::ticks_to_secs(tVar11 - tVar9);
                printf("lzham_compress_reinit took %3.3fms\n",dVar19 * 1000.0);
                uVar4 = 0;
                fseek(__stream,0,0);
                fseek(__stream_00,local_38,0);
                __n = 0;
                uVar8 = uVar17;
              }
              iVar16 = iVar2 + 1;
              if (iVar2 + 1 == local_a8) {
                tVar9 = timer::get_ticks();
                lVar7 = (*lzham_dll->lzham_compress_deinit)(pvVar10);
                tVar11 = timer::get_ticks();
                dVar19 = timer::ticks_to_secs(tVar11 - tVar9);
                local_d8 = local_d8 + (float)dVar19;
                if (local_40 != (float *)0x0) {
                  *local_40 = local_d8;
                }
                tVar11 = timer::get_ticks();
                tVar9 = 1;
                if (tVar11 - local_58 != 0) {
                  tVar9 = tVar11 - local_58;
                }
                dVar19 = timer::ticks_to_secs(tVar9);
                local_68._0_8_ = dVar19;
                uVar15 = ftello64(__stream_00);
                free(__ptr);
                free(__ptr_00);
                free(local_a0.m_pSeed_bytes);
                local_a0.m_pSeed_bytes = (void *)0x0;
                fclose(__stream);
                fclose(__stream_00);
                if (lVar6 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
                  if (uVar8 + ((int)__n - uVar4) == 0) {
                    puts("Success");
                    printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",
                           uVar17,uVar15);
                    printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                           ,(double)local_d8,(double)((float)(unkint9)Var1 / local_d8),
                           SUB84((double)((float)uVar15 / local_d8),0));
                    auVar21._8_4_ = (int)(uVar17 >> 0x20);
                    auVar21._0_8_ = uVar17;
                    auVar21._12_4_ = 0x45300000;
                    auVar23._8_4_ = (int)(uVar15 >> 0x20);
                    auVar23._0_8_ = uVar15;
                    auVar23._12_4_ = 0x45300000;
                    printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                           ,local_68._0_8_,
                           ((auVar21._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) /
                           (double)local_68._0_8_,
                           SUB84(((auVar23._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0)) /
                                 (double)local_68._0_8_,0));
                    printf("Input file adler32: 0x%08X\n",lVar7);
                    return true;
                  }
                  print_error("Compressor failed to consume entire input file!\n");
                  return false;
                }
                print_error("Compression failed with status %i\n");
                return false;
              }
            }
          }
          __n = 0x40000;
          if (uVar8 < 0x40000) {
            __n = uVar8;
          }
          sVar13 = fread(__ptr,1,__n,__stream);
          if (sVar13 == __n) {
            uVar8 = uVar8 - __n;
            uVar4 = 0;
            goto LAB_00104ceb;
          }
          putchar(10);
          print_error("Failure reading from source file!\n");
          free(__ptr);
LAB_00105068:
          free(__ptr_00);
          fclose(__stream);
LAB_0010507c:
          fclose(__stream_00);
          free(local_a0.m_pSeed_bytes);
          (*lzham_dll->lzham_compress_deinit)(pvVar10);
          return false;
        }
        (*lzham_dll->lzham_compress_deinit)(pvVar10);
      }
      print_error("Failed initializing compressor!\n");
      free(__ptr);
      free(__ptr_00);
      fclose(__stream);
      fclose(__stream_00);
      free(local_a0.m_pSeed_bytes);
      return false;
    }
    pMsg = "Unable to create file: %s\n";
  }
  print_error(pMsg,pDst_filename);
  return false;
}

Assistant:

static bool compress_file(ilzham &lzham_dll, const char* pSrc_filename, const char *pDst_filename, const comp_options &options, const char *pSeed_filename, float *pTotal_comp_time = NULL)
{
	if (pTotal_comp_time)
		*pTotal_comp_time = 0;

   printf("Testing: Streaming compression\n");

   FILE *pInFile = fopen(pSrc_filename, "rb");
   if (!pInFile)
   {
      print_error("Unable to read file: %s\n", pSrc_filename);
      return false;
   }

   FILE *pOutFile = fopen(pDst_filename, "wb");
   if (!pOutFile)
   {
      print_error("Unable to create file: %s\n", pDst_filename);
      return false;
   }

   _fseeki64(pInFile, 0, SEEK_END);
   uint64 src_file_size = _ftelli64(pInFile);
   _fseeki64(pInFile, 0, SEEK_SET);

   fputc('L', pOutFile);
   fputc('Z', pOutFile);
   fputc('H', pOutFile);
   fputc('0', pOutFile);
   fputc(options.m_dict_size_log2, pOutFile);

   for (uint i = 0; i < 8; i++)
   {
      fputc(static_cast<int>((src_file_size >> (i * 8)) & 0xFF), pOutFile);
   }

   uint64 cmp_file_header_size = _ftelli64(pOutFile);

   const uint cInBufSize = LZHAMTEST_COMP_INPUT_BUFFER_SIZE;
   const uint cOutBufSize = LZHAMTEST_COMP_OUTPUT_BUFFER_SIZE;

   uint8 *in_file_buf = static_cast<uint8*>(_aligned_malloc(cInBufSize, 16));
   uint8 *out_file_buf = static_cast<uint8*>(_aligned_malloc(cOutBufSize, 16));
   if ((!in_file_buf) || (!out_file_buf))
   {
      print_error("Out of memory!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   uint64 src_bytes_left = src_file_size;

   uint in_file_buf_size = 0;
   uint in_file_buf_ofs = 0;

   uint64 total_output_bytes = 0;

   timer_ticks start_time = timer::get_ticks();

   lzham_compress_params params;
   memset(&params, 0, sizeof(params));
   params.m_struct_size = sizeof(lzham_compress_params);
   params.m_dict_size_log2 = options.m_dict_size_log2;
   params.m_max_helper_threads = options.m_max_helper_threads;
   params.m_level = options.m_comp_level;
   if (options.m_extreme_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;
   if (options.m_deterministic_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_DETERMINISTIC_PARSING;
   if (options.m_tradeoff_decomp_rate_for_comp_ratio)
      params.m_compress_flags |= LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO;
   if (options.m_force_single_threaded_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING;
   if (options.m_low_memory_finder)
      params.m_compress_flags |= LZHAM_COMP_FLAG_USE_LOW_MEMORY_MATCH_FINDER;
   params.m_fast_bytes = options.m_fast_bytes;

   params.m_table_update_rate = options.m_table_update_rate;
   params.m_extreme_parsing_max_best_arrivals  = options.m_max_best_arrivals;

   if (pSeed_filename)
   {
      if (!read_seed_file(pSeed_filename, params.m_num_seed_bytes, params.m_pSeed_bytes, params.m_dict_size_log2))
      {
         _aligned_free(in_file_buf);
         _aligned_free(out_file_buf);
         fclose(pInFile);
         fclose(pOutFile);
         return false;
      }
   }

   timer_ticks init_start_time = timer::get_ticks();
   lzham_compress_state_ptr pComp_state = lzham_dll.lzham_compress_init(&params);
   timer_ticks total_init_time = timer::get_ticks() - init_start_time;

	float total_comp_time = (float)timer::ticks_to_secs(total_init_time);

   if ((pComp_state) && (options.m_test_compressor_reinit))
   {
      if (!lzham_dll.lzham_compress_reinit(pComp_state))
      {
         lzham_dll.lzham_compress_deinit(pComp_state);
         pComp_state = NULL;
      }
   }

   if (!pComp_state)
   {
      print_error("Failed initializing compressor!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      _aligned_free((void*)params.m_pSeed_bytes);
      return false;
   }

   printf("lzham_compress_init took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

   lzham_compress_status_t status = LZHAM_COMP_STATUS_FAILED;

   // Performs 1 pass normally, or 2 passes to test compressor reinitialization (with a reinit in between the passes).
   uint total_passes = options.m_test_compressor_reinit ? 2 : 1;
   for (uint pass = 0; pass < total_passes; ++pass)
   {
      for ( ; ; )
      {
         if (src_file_size)
         {
            double total_elapsed_time = timer::ticks_to_secs(timer::get_ticks() - start_time);
            double total_bytes_processed = static_cast<double>(src_file_size - src_bytes_left);
            double comp_rate = (total_elapsed_time > 0.0f) ? total_bytes_processed / total_elapsed_time : 0.0f;

   #ifdef LZHAM_PRINT_OUTPUT_PROGRESS
            for (int i = 0; i < 15; i++)
               printf("\b\b\b\b");
            printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec", (1.0f - (static_cast<float>(src_bytes_left) / src_file_size)) * 100.0f, src_bytes_left / 1048576.0f, comp_rate / (1024.0f * 1024.0f));
            printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
   #endif
         }

         if (in_file_buf_ofs == in_file_buf_size)
         {
            in_file_buf_size = static_cast<uint>(my_min(cInBufSize, src_bytes_left));

            if (fread(in_file_buf, 1, in_file_buf_size, pInFile) != in_file_buf_size)
            {
               printf("\n");
               print_error("Failure reading from source file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            src_bytes_left -= in_file_buf_size;

            in_file_buf_ofs = 0;
         }

         uint8 *pIn_bytes = &in_file_buf[in_file_buf_ofs];
         size_t num_in_bytes = in_file_buf_size - in_file_buf_ofs;
         uint8* pOut_bytes = out_file_buf;
         size_t out_num_bytes = cOutBufSize;

			timer_ticks comp_start_time = timer::get_ticks();
         status = lzham_dll.lzham_compress(pComp_state, pIn_bytes, &num_in_bytes, pOut_bytes, &out_num_bytes, src_bytes_left == 0);
			timer_ticks comp_time = timer::get_ticks() - comp_start_time;

			total_comp_time += (float)timer::ticks_to_secs(comp_time);

         if (num_in_bytes)
         {
            in_file_buf_ofs += (uint)num_in_bytes;
            assert(in_file_buf_ofs <= in_file_buf_size);
         }

         if (out_num_bytes)
         {
            if (fwrite(out_file_buf, 1, static_cast<uint>(out_num_bytes), pOutFile) != out_num_bytes)
            {
               printf("\n");
               print_error("Failure writing to destination file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            total_output_bytes += out_num_bytes;
         }

         if (status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
            break;
      }

#ifdef LZHAM_PRINT_OUTPUT_PROGRESS
      for (int i = 0; i < 15; i++)
      {
         printf("\b\b\b\b    \b\b\b\b");
      }
#endif

      if ((pass == 0) && (total_passes == 2))
      {
         printf("\n");

         uint64 cmp_file_size = _ftelli64(pOutFile);
         printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);

         init_start_time = timer::get_ticks();
         if (!lzham_dll.lzham_compress_reinit(pComp_state))
         {
            print_error("Failed reinitializing compressor!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            _aligned_free((void*)params.m_pSeed_bytes);
            lzham_dll.lzham_compress_deinit(pComp_state);
            return false;
         }
         total_init_time = timer::get_ticks() - init_start_time;
         printf("lzham_compress_reinit took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

         fseek(pInFile, 0, SEEK_SET);
         fseek(pOutFile, static_cast<long>(cmp_file_header_size), SEEK_SET);

         src_bytes_left = src_file_size;
         in_file_buf_size = 0;
         in_file_buf_ofs = 0;
         total_output_bytes = 0;
      }
   }

   src_bytes_left += (in_file_buf_size - in_file_buf_ofs);

	timer_ticks deinit_start_time = timer::get_ticks();
   uint32 adler32 = lzham_dll.lzham_compress_deinit(pComp_state);
	timer_ticks total_deinit_time = timer::get_ticks() - deinit_start_time;

	total_comp_time += (float)timer::ticks_to_secs(total_deinit_time);
	if (pTotal_comp_time)
		*pTotal_comp_time = total_comp_time;

   pComp_state = NULL;

   timer_ticks end_time = timer::get_ticks();
   double total_time = timer::ticks_to_secs(my_max(1, end_time - start_time));

   uint64 cmp_file_size = _ftelli64(pOutFile);

   _aligned_free(in_file_buf);
   in_file_buf = NULL;
   _aligned_free(out_file_buf);
   out_file_buf = NULL;
   _aligned_free((void*)params.m_pSeed_bytes);
   params.m_pSeed_bytes = NULL;

   fclose(pInFile);
   pInFile = NULL;
   fclose(pOutFile);
   pOutFile = NULL;

   if (status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression failed with status %i\n", status);
      return false;
   }

   if (src_bytes_left)
   {
      print_error("Compressor failed to consume entire input file!\n");
      return false;
   }

   printf("Success\n");
   printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);
	printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_comp_time, src_file_size / total_comp_time, cmp_file_size / total_comp_time);
   printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_time, src_file_size / total_time, cmp_file_size / total_time);
   printf("Input file adler32: 0x%08X\n", adler32);

   return true;
}